

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,8,0,_1,8>>,float,float>
               (Matrix<float,__1,_8,_0,__1,_8> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_8,_0,__1,_8>_>
               *src,assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_8,_0,__1,_8>_>
  *src_local;
  Matrix<float,__1,_8,_0,__1,_8> *dst_local;
  
  IVar1 = CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>
          ::rows(src);
  cols = CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>
         ::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>);
    if (IVar2 == cols) goto LAB_001c7fed;
  }
  PlainObjectBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,IVar1,cols);
LAB_001c7fed:
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 8>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 8>>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}